

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

bool __thiscall
DependencyScan::RecomputeOutputsDirty
          (DependencyScan *this,Edge *edge,Node *most_recent_input,bool *outputs_dirty,string *err)

{
  bool bVar1;
  pointer ppNVar2;
  string command;
  
  Edge::EvaluateCommand_abi_cxx11_(&command,edge,true);
  ppNVar2 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppNVar2 ==
        (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00111f02;
    bVar1 = RecomputeOutputDirty(this,edge,most_recent_input,&command,*ppNVar2);
    ppNVar2 = ppNVar2 + 1;
  } while (!bVar1);
  *outputs_dirty = true;
LAB_00111f02:
  std::__cxx11::string::~string((string *)&command);
  return true;
}

Assistant:

bool DependencyScan::RecomputeOutputsDirty(Edge* edge, Node* most_recent_input,
                                           bool* outputs_dirty, string* err) {
  string command = edge->EvaluateCommand(/*incl_rsp_file=*/true);
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (RecomputeOutputDirty(edge, most_recent_input, command, *o)) {
      *outputs_dirty = true;
      return true;
    }
  }
  return true;
}